

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemastypes.c
# Opt level: O1

xmlSchemaTypePtr xmlSchemaInitBasicType(char *name,xmlSchemaValType type,xmlSchemaTypePtr baseType)

{
  byte *pbVar1;
  ulong uVar2;
  int iVar3;
  xmlSchemaTypePtr type_00;
  xmlSchemaFacetPtr facet;
  xmlSchemaValPtr pxVar4;
  xmlChar *__s;
  uint uVar5;
  
  uVar2 = (ulong)type;
  type_00 = (xmlSchemaTypePtr)(*xmlMalloc)(0xe0);
  if (type_00 == (xmlSchemaTypePtr)0x0) {
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xf,
                        (xmlError *)0x0);
    return (xmlSchemaTypePtr)0x0;
  }
  memset(type_00,0,0xe0);
  type_00->name = (xmlChar *)name;
  type_00->targetNamespace = (xmlChar *)"http://www.w3.org/2001/XMLSchema";
  type_00->type = XML_SCHEMA_TYPE_BASIC;
  type_00->baseType = baseType;
  type_00->contentType = XML_SCHEMA_CONTENT_BASIC;
  if ((type < (XML_SCHEMAS_ANYSIMPLETYPE|XML_SCHEMAS_STRING)) &&
     (((0x18003020fffaU >> (uVar2 & 0x3f) & 1) == 0 ||
      (pbVar1 = (byte *)((long)&type_00->flags + 1), *pbVar1 = *pbVar1 | 0x40,
      type < (XML_SCHEMAS_ANYSIMPLETYPE|XML_SCHEMAS_STRING))))) {
    if ((0xa080000UL >> (uVar2 & 0x3f) & 1) == 0) {
      if ((0x600000000000U >> (uVar2 & 0x3f) & 1) != 0) goto LAB_001abd86;
      goto LAB_001abcda;
    }
    *(byte *)&type_00->flags = (byte)type_00->flags | 0x40;
    facet = xmlSchemaNewFacet();
    if (facet == (xmlSchemaFacetPtr)0x0) {
LAB_001abd71:
      facet = (xmlSchemaFacetPtr)0x0;
    }
    else {
      facet->type = XML_SCHEMA_FACET_MINLENGTH;
      pxVar4 = (xmlSchemaValPtr)(*xmlMalloc)(0x30);
      if (pxVar4 == (xmlSchemaValPtr)0x0) {
        pxVar4 = (xmlSchemaValPtr)0x0;
      }
      else {
        *(undefined8 *)pxVar4 = 0;
        pxVar4->next = (_xmlSchemaVal *)0x0;
        (pxVar4->value).date.sec = 0.0;
        *(undefined8 *)((long)&pxVar4->value + 0x18) = 0;
        (pxVar4->value).decimal.str = (xmlChar *)0x0;
        (pxVar4->value).dur.day = 0;
        pxVar4->type = XML_SCHEMAS_NNINTEGER;
      }
      facet->val = pxVar4;
      if (pxVar4 == (xmlSchemaValPtr)0x0) {
        (*xmlFree)(facet);
        goto LAB_001abd71;
      }
      iVar3 = snprintf((char *)0x0,0,"%+d.0",1);
      pxVar4 = facet->val;
      __s = (xmlChar *)(*xmlMalloc)((long)(iVar3 + 1));
      (pxVar4->value).decimal.str = __s;
      if (__s == (xmlChar *)0x0) {
        xmlSchemaFreeFacet(facet);
        goto LAB_001abd71;
      }
      snprintf((char *)__s,(long)(iVar3 + 1),"%+d.0",1);
      (pxVar4->value).decimal.integralPlaces = iVar3 - 3;
      (pxVar4->value).decimal.fractionalPlaces = 1;
    }
    type_00->facets = facet;
    uVar5 = 0x8000000;
  }
  else {
LAB_001abcda:
    uVar5 = 0x100;
  }
  type_00->flags = type_00->flags | uVar5;
LAB_001abd86:
  iVar3 = xmlHashAddEntry2(xmlSchemaTypesBank,type_00->name,
                           (xmlChar *)"http://www.w3.org/2001/XMLSchema",type_00);
  if (iVar3 < 0) {
    xmlSchemaFreeType(type_00);
    type_00 = (xmlSchemaTypePtr)0x0;
  }
  else {
    type_00->builtInType = type;
  }
  return type_00;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaInitBasicType(const char *name, xmlSchemaValType type,
		       xmlSchemaTypePtr baseType) {
    xmlSchemaTypePtr ret;

    ret = (xmlSchemaTypePtr) xmlMalloc(sizeof(xmlSchemaType));
    if (ret == NULL) {
        xmlSchemaTypeErrMemory();
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaType));
    ret->name = (const xmlChar *)name;
    ret->targetNamespace = XML_SCHEMAS_NAMESPACE_NAME;
    ret->type = XML_SCHEMA_TYPE_BASIC;
    ret->baseType = baseType;
    ret->contentType = XML_SCHEMA_CONTENT_BASIC;
    /*
    * Primitive types.
    */
    switch (type) {
	case XML_SCHEMAS_STRING:
	case XML_SCHEMAS_DECIMAL:
	case XML_SCHEMAS_DATE:
	case XML_SCHEMAS_DATETIME:
	case XML_SCHEMAS_TIME:
	case XML_SCHEMAS_GYEAR:
	case XML_SCHEMAS_GYEARMONTH:
	case XML_SCHEMAS_GMONTH:
	case XML_SCHEMAS_GMONTHDAY:
	case XML_SCHEMAS_GDAY:
	case XML_SCHEMAS_DURATION:
	case XML_SCHEMAS_FLOAT:
	case XML_SCHEMAS_DOUBLE:
	case XML_SCHEMAS_BOOLEAN:
	case XML_SCHEMAS_ANYURI:
	case XML_SCHEMAS_HEXBINARY:
	case XML_SCHEMAS_BASE64BINARY:
	case XML_SCHEMAS_QNAME:
	case XML_SCHEMAS_NOTATION:
	    ret->flags |= XML_SCHEMAS_TYPE_BUILTIN_PRIMITIVE;
	    break;
	default:
	    break;
    }
    /*
    * Set variety.
    */
    switch (type) {
	case XML_SCHEMAS_ANYTYPE:
	case XML_SCHEMAS_ANYSIMPLETYPE:
	    break;
	case XML_SCHEMAS_IDREFS:
	case XML_SCHEMAS_NMTOKENS:
	case XML_SCHEMAS_ENTITIES:
	    ret->flags |= XML_SCHEMAS_TYPE_VARIETY_LIST;
	    ret->facets = xmlSchemaNewMinLengthFacet(1);
	    ret->flags |= XML_SCHEMAS_TYPE_HAS_FACETS;
	    break;
	default:
	    ret->flags |= XML_SCHEMAS_TYPE_VARIETY_ATOMIC;
	    break;
    }
    if (xmlHashAddEntry2(xmlSchemaTypesBank, ret->name,
	                 XML_SCHEMAS_NAMESPACE_NAME, ret) < 0) {
        xmlSchemaFreeType(ret);
        return(NULL);
    }
    ret->builtInType = type;
    return(ret);
}